

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlSetObjectBool(JlDataObject *BoolObject,_Bool BoolValue)

{
  JL_STATUS JVar1;
  
  if (BoolObject != (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_WRONG_TYPE;
    if (BoolObject->Type == JL_DATA_TYPE_BOOL) {
      (BoolObject->field_2).Boolean = BoolValue;
      JVar1 = JL_STATUS_SUCCESS;
    }
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlSetObjectBool
    (
        JlDataObject*   BoolObject,
        bool            BoolValue
    )
{
    JL_STATUS jlStatus;

    if( NULL != BoolObject )
    {
        if( JL_DATA_TYPE_BOOL == BoolObject->Type )
        {
            BoolObject->Boolean = BoolValue ? true : false;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}